

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.h
# Opt level: O0

FArchive * operator<<(FArchive *arc,TArray<FSectorPortal,_FSectorPortal> *self)

{
  bool bVar1;
  DWORD amount;
  uint local_20;
  uint i;
  DWORD numStored;
  TArray<FSectorPortal,_FSectorPortal> *self_local;
  FArchive *arc_local;
  
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    FArchive::WriteCount(arc,self->Count);
  }
  else {
    amount = FArchive::ReadCount(arc);
    TArray<FSectorPortal,_FSectorPortal>::Resize(self,amount);
  }
  for (local_20 = 0; local_20 < self->Count; local_20 = local_20 + 1) {
    operator<<(arc,self->Array + local_20);
  }
  return arc;
}

Assistant:

inline FArchive &operator<< (FArchive &arc, TArray<T,TT> &self)
{
	if (arc.IsStoring())
	{
		arc.WriteCount(self.Count);
	}
	else
	{
		DWORD numStored = arc.ReadCount();
		self.Resize(numStored);
	}
	for (unsigned int i = 0; i < self.Count; ++i)
	{
		arc << self.Array[i];
	}
	return arc;
}